

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

int __thiscall MNS::Response::end(Response *this,char *data,uint dataLen)

{
  pointer pcVar1;
  bool bVar2;
  Response *pRVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  char *__dest;
  void *pvVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  char *__src;
  int iVar11;
  string strDataLen;
  string msg;
  char *local_88;
  uint local_80;
  undefined4 uStack_7c;
  char local_78 [16];
  ulong local_68;
  Response *local_60;
  char *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  uVar6 = dataLen + 0x200;
  local_58 = data;
  if (this->bufferSize < uVar6) {
    uVar10 = 0x1000;
    if (0x1000 < uVar6) {
      uVar10 = uVar6;
    }
    uVar10 = this->bufferSize + uVar10;
    this->bufferSize = uVar10;
    __dest = (char *)realloc(this->responseBuffer,(ulong)uVar10);
    this->responseBuffer = __dest;
  }
  else {
    __dest = this->responseBuffer;
  }
  __src = "HTTP/1.0 ";
  if (this->socketData->request->httpVersion == HTTP_1_1) {
    __src = "HTTP/1.1 ";
  }
  pvVar7 = mempcpy(__dest,__src,9);
  pmVar8 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&Server::response_msgs_abi_cxx11_,&this->statusCode);
  local_50 = local_40;
  pcVar1 = (pmVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + pmVar8->_M_string_length);
  pvVar7 = mempcpy(pvVar7,local_50,local_48);
  cVar5 = '\x01';
  uVar6 = this->bufferLen + dataLen;
  if (9 < uVar6) {
    uVar10 = uVar6;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar10 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001099cc;
      }
      if (uVar10 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001099cc;
      }
      if (uVar10 < 10000) goto LAB_001099cc;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_001099cc:
  local_88 = local_78;
  local_68 = (ulong)dataLen;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_88,local_80,uVar6);
  pvVar7 = mempcpy(pvVar7,"Content-Length",0xe);
  pvVar7 = mempcpy(pvVar7,": ",2);
  pvVar7 = mempcpy(pvVar7,local_88,CONCAT44(uStack_7c,local_80));
  pvVar7 = mempcpy(pvVar7,"\r\n",2);
  if (this->sendDate == true) {
    pvVar7 = mempcpy(pvVar7,"Date",4);
    pvVar7 = mempcpy(pvVar7,": ",2);
    pvVar7 = mempcpy(pvVar7,Server::currTime_abi_cxx11_._M_dataplus._M_p,
                     CONCAT44(Server::currTime_abi_cxx11_._M_string_length._4_4_,
                              (int)Server::currTime_abi_cxx11_._M_string_length));
    pvVar7 = mempcpy(pvVar7,"\r\n",2);
    iVar11 = local_80 + (int)local_48 + 0x23 + (int)Server::currTime_abi_cxx11_._M_string_length;
  }
  else {
    iVar11 = local_80 + 0x1b + (int)local_48;
  }
  local_60 = this;
  for (p_Var9 = (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(this->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    pvVar7 = mempcpy(pvVar7,*(void **)(p_Var9 + 1),(size_t)p_Var9[1]._M_parent);
    pvVar7 = mempcpy(pvVar7,": ",2);
    pvVar7 = mempcpy(pvVar7,*(void **)(p_Var9 + 2),(size_t)p_Var9[2]._M_parent);
    pvVar7 = mempcpy(pvVar7,"\r\n",2);
    iVar11 = iVar11 + 4 + *(int *)&p_Var9[2]._M_parent + *(int *)&p_Var9[1]._M_parent;
  }
  pvVar7 = mempcpy(pvVar7,"\r\n",2);
  pRVar3 = local_60;
  uVar6 = iVar11 + 2;
  if ((ulong)local_60->bufferLen != 0) {
    pvVar7 = mempcpy(pvVar7,local_60->buffer,(ulong)local_60->bufferLen);
    uVar6 = uVar6 + pRVar3->bufferLen;
  }
  if (local_58 != (char *)0x0) {
    iVar11 = (int)local_68;
    mempcpy(pvVar7,local_58,local_68 & 0xffffffff);
    uVar6 = uVar6 + iVar11;
  }
  pRVar3->bufferLen = uVar6;
  iVar11 = uv_is_closing(pRVar3->socketData->poll_h);
  if (iVar11 == 0) {
    uv_poll_start(pRVar3->socketData->poll_h,2,Server::onWriteData);
  }
  pRVar3->finished = true;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return 0;
}

Assistant:

int MNS::Response::end(const char *data, unsigned int dataLen) {
//	int offset = std::sprintf(this->buffer, "HTTP/1.1 200 OK\r\nContent-Length: %u\r\n\r\n", (unsigned int) dataLen);
//	memcpy(this->buffer+offset, data, dataLen);
//
//	this->bufferLen = offset + dataLen;
//
//	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
//	return 0;

	if(this->bufferSize < dataLen + 512) {
		int ns = std::max(dataLen + 512, (unsigned int)4096);
		this->bufferSize = this->bufferSize + ns;
		this->responseBuffer = (char *)realloc(this->responseBuffer, this->bufferSize);
	}

	int offset = 0;
	//this->setHeader(std::string("Date", 4), MNS::Server::currTime);
	//this->setHeader(std::string("Content-Length", 14), std::to_string(dataLen));

	MNS::Request *request = this->socketData->request;
	char *rb = this->responseBuffer;
	// First print the status code
	rb = (char *)mempcpy(rb, (request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	// Copy the response MSG
	std::string msg = MNS::Server::response_msgs[this->statusCode];
	rb = (char *)mempcpy(rb, msg.c_str(), msg.length());
	offset += msg.length() + 9;

	// Set the static headers

	// Content-Length
	std::string strDataLen = std::to_string(bufferLen + dataLen);
	rb = (char *)mempcpy(rb, "Content-Length", 14);
	rb = (char *)mempcpy(rb, ": ", 2);
	rb = (char *)mempcpy(rb, strDataLen.c_str(), strDataLen.length());
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += strDataLen.length() + 18;

	// Date
	if(this->sendDate) {
		rb = (char *) mempcpy(rb, "Date", 4);
		rb = (char *) mempcpy(rb, ": ", 2);
		rb = (char *) mempcpy(rb, MNS::Server::currTime.c_str(), MNS::Server::currTime.length());
		rb = (char *) mempcpy(rb, "\r\n", 2);
		offset += MNS::Server::currTime.length() + 8;
	}

	// Copy the headers
	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		rb = (char *)mempcpy(rb, header->first.c_str(), header->first.length());
		rb = (char *)mempcpy(rb, ": ", 2);
		rb = (char *)mempcpy(rb, header->second.c_str(), header->second.length());
		rb = (char *)mempcpy(rb, "\r\n", 2);
		offset += header->first.length() + header->second.length() + 4;
	}

	// Copy trailing line end
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += 2;

	// Finally copy the buffer
	if(this->bufferLen) {
		rb = (char *)mempcpy(rb, this->buffer, this->bufferLen);
		offset += this->bufferLen;
	}

	// Copy the sent data
	if(data) {
		rb = (char *)mempcpy(rb, data, dataLen);
		offset += dataLen;
	}

	this->bufferLen = offset;

	if(!uv_is_closing((uv_handle_t*)this->socketData->poll_h))
		uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;

	/*
	MNS::Request *request = this->socketData->request;

	if(data) {
		//unsigned int dataLen = strlen(data);
		if(this->bufferSize - bufferLen < dataLen) {
			this->bufferSize = (dataLen>1024)?this->bufferSize + dataLen:this->bufferSize + 1024;
			this->buffer = (char *)realloc(this->buffer, this->bufferSize);
		}

		memcpy(this->buffer + this->bufferLen, data, dataLen);
		this->bufferLen += dataLen;
	}


	this->setHeader(std::string("Content-Length", 14), std::to_string(this->bufferLen));
	this->setHeader("Date", MNS::Server::currTime);

	response.append((request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	response.append(MNS::Server::response_msgs[this->statusCode]);

	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		response.append(header->first);
		response.append(": ", 2);
		response.append(header->second);
		response.append("\r\n", 2);
	}

	response.append("\r\n", 2);
	response.append(this->buffer, this->bufferLen);

//	ssize_t numSent = send(this->socketData->fd, response.c_str(), response.length(), 0);
//	if(numSent == (int)response.length()) {
//		this->bufferLen = 0;
//		response.clear();
//		//uv_poll_start(handle, UV_READABLE, onReadData);
//	}
//	uv_poll_start(this->socketData->poll_h, UV_READABLE, MNS::Server::onReadData);
	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;*/
}